

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_multithreaded_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3386dc::AV1DecodeMultiThreadedTest::UpdateMD5
          (AV1DecodeMultiThreadedTest *this,Decoder *dec,aom_codec_cx_pkt_t *pkt,MD5 *md5)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_RDX;
  AssertHelper *in_RSI;
  aom_codec_err_t *in_RDI;
  aom_image_t *img;
  AssertionResult gtest_ar;
  aom_codec_err_t res;
  uint8_t *in_stack_ffffffffffffff68;
  Decoder *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff80 [16];
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  Type in_stack_ffffffffffffff9c;
  uint uVar2;
  MD5 *in_stack_ffffffffffffffa0;
  AssertionResult local_38;
  aom_codec_err_t local_24;
  
  local_24 = libaom_test::Decoder::DecodeFrame
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x4f9366);
  if (local_24 != AOM_CODEC_OK) {
    *(undefined1 *)(in_RDI + 10) = AOM_CODEC_ERROR;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              (in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,in_RDI,
               (aom_codec_err_t *)in_stack_ffffffffffffff70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x4f93d3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff80._12_4_,
                 in_stack_ffffffffffffff80._0_8_);
      testing::internal::AssertHelper::operator=(in_RSI,in_RDX);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x4f9421);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4f9481);
    if (uVar2 != 0) {
      return;
    }
    in_stack_ffffffffffffff9c = kSuccess;
  }
  libaom_test::Decoder::GetDxData((Decoder *)0x4f94a8);
  libaom_test::DxDataIterator::Next((DxDataIterator *)0x4f94bc);
  libaom_test::MD5::Add
            (in_stack_ffffffffffffffa0,
             (aom_image_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return;
}

Assistant:

void UpdateMD5(::libaom_test::Decoder *dec, const aom_codec_cx_pkt_t *pkt,
                 ::libaom_test::MD5 *md5) {
    const aom_codec_err_t res = dec->DecodeFrame(
        reinterpret_cast<uint8_t *>(pkt->data.frame.buf), pkt->data.frame.sz);
    if (res != AOM_CODEC_OK) {
      abort_ = true;
      ASSERT_EQ(AOM_CODEC_OK, res);
    }
    const aom_image_t *img = dec->GetDxData().Next();
    md5->Add(img);
  }